

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O2

void __thiscall helics::apps::Probe::Probe(Probe *this,string_view appName,FederateInfo *fedInfo)

{
  App::App(&this->super_App,appName,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Probe_00483218;
  Endpoint::Endpoint(&this->endpoint);
  this->connections = 0;
  this->messagesReceived = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view appName, const FederateInfo& fedInfo): App(appName, fedInfo) {}